

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O0

zip_t * read_from_file(char *archive,int flags,zip_error_t *error,zip_uint64_t offset,
                      zip_uint64_t length)

{
  zip_uint64_t zVar1;
  int iVar2;
  int *piVar3;
  undefined4 local_4c;
  long lStack_48;
  int err;
  zip_source_t *source;
  zip_t *zaa;
  zip_uint64_t length_local;
  zip_uint64_t offset_local;
  zip_error_t *error_local;
  char *pcStack_18;
  int flags_local;
  char *archive_local;
  
  zaa = (zip_t *)length;
  length_local = offset;
  offset_local = (zip_uint64_t)error;
  error_local._4_4_ = flags;
  pcStack_18 = archive;
  if ((offset == 0) && (length == 0)) {
    iVar2 = strcmp(archive,"/dev/stdin");
    if (iVar2 == 0) {
      source = (zip_source_t *)zip_fdopen(0,error_local._4_4_ & 0xfffffffe,&local_4c);
    }
    else {
      source = (zip_source_t *)zip_open(pcStack_18,error_local._4_4_,&local_4c);
    }
    zVar1 = offset_local;
    if (source == (zip_source_t *)0x0) {
      piVar3 = __errno_location();
      zip_error_set(zVar1,local_4c,*piVar3);
      return (zip_t *)0x0;
    }
  }
  else {
    if (0x7fffffffffffffff < length) {
      zip_error_set(error,0x12,0);
      return (zip_t *)0x0;
    }
    lStack_48 = zip_source_file_create(archive,offset,length,error);
    if ((lStack_48 == 0) ||
       (source = (zip_source_t *)zip_open_from_source(lStack_48,error_local._4_4_,offset_local),
       source == (zip_source_t *)0x0)) {
      zip_source_free(lStack_48);
      return (zip_t *)0x0;
    }
  }
  return (zip_t *)source;
}

Assistant:

static zip_t *
read_from_file(const char *archive, int flags, zip_error_t *error, zip_uint64_t offset, zip_uint64_t length) {
    zip_t *zaa;
    zip_source_t *source;
    int err;

    if (offset == 0 && length == 0) {
	if (strcmp(archive, "/dev/stdin") == 0) {
	    zaa = zip_fdopen(STDIN_FILENO, flags & ~ZIP_CREATE, &err);
	}
	else {
	    zaa = zip_open(archive, flags, &err);
	}
	if (zaa == NULL) {
	    zip_error_set(error, err, errno);
	    return NULL;
	}
    }
    else {
	if (length > ZIP_INT64_MAX) {
	    zip_error_set(error, ZIP_ER_INVAL, 0);
	    return NULL;
	}
	if ((source = zip_source_file_create(archive, offset, (zip_int64_t)length, error)) == NULL || (zaa = zip_open_from_source(source, flags, error)) == NULL) {
	    zip_source_free(source);
	    return NULL;
	}
    }

    return zaa;
}